

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Reader::FlushProfiler(BP5Reader *this)

{
  __pid_t _Var1;
  void *this_00;
  char *__filename;
  FileFStream *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  stringstream PIDstr;
  __pid_t PID;
  string bpBaseName;
  FileFStream profilingJSONStream;
  string profileFileName;
  vector<char,_std::allocator<char>_> profilingJSON;
  string LineJSON;
  uint i;
  anon_class_16_2_75bba2ca lf_AddMe;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypes;
  char *in_stack_fffffffffffff980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff988;
  string *this_02;
  string *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  TransportMan *in_stack_fffffffffffff9c8;
  Comm *in_stack_fffffffffffff9e8;
  FileFStream *in_stack_fffffffffffff9f0;
  TransportMan *in_stack_fffffffffffff9f8;
  string local_5f8 [32];
  string local_5d8 [16];
  TransportMan *in_stack_fffffffffffffa38;
  FileFStream *in_stack_fffffffffffffa40;
  string local_5b8 [32];
  stringstream local_598 [16];
  size_t in_stack_fffffffffffffa78;
  size_t in_stack_fffffffffffffa80;
  char *in_stack_fffffffffffffa88;
  FileFStream *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffab0;
  JSONProfiler *in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffba2;
  undefined1 in_stack_fffffffffffffba3;
  Mode in_stack_fffffffffffffba4;
  string *in_stack_fffffffffffffba8;
  FileFStream *in_stack_fffffffffffffbb0;
  string local_408 [824];
  string local_d0 [32];
  vector<char,_std::allocator<char>_> local_b0;
  string local_98 [32];
  string local_78 [32];
  uint local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined8 in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  JSONProfiler *in_stack_ffffffffffffffe8;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffe0;
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_(in_stack_fffffffffffff9f8);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffc8;
  transportman::TransportMan::GetTransportsProfilers(in_stack_fffffffffffff9c8);
  local_48 = __rhs;
  local_40 = __lhs;
  FlushProfiler::anon_class_16_2_75bba2ca::operator()
            ((anon_class_16_2_75bba2ca *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  FlushProfiler::anon_class_16_2_75bba2ca::operator()
            ((anon_class_16_2_75bba2ca *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  FlushProfiler::anon_class_16_2_75bba2ca::operator()
            ((anon_class_16_2_75bba2ca *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  for (local_58 = 0; local_58 < (uint)in_RDI[0x3c]._M_string_length; local_58 = local_58 + 1) {
    std::
    vector<adios2::transportman::TransportMan,_std::allocator<adios2::transportman::TransportMan>_>
    ::operator[]((vector<adios2::transportman::TransportMan,_std::allocator<adios2::transportman::TransportMan>_>
                  *)&in_RDI[0x3c].field_2,(ulong)local_58);
    FlushProfiler::anon_class_16_2_75bba2ca::operator()
              ((anon_class_16_2_75bba2ca *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  }
  profiling::JSONProfiler::GetRankProfilingJSON
            (in_stack_ffffffffffffffe8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffffe0,
             (vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
              *)in_stack_ffffffffffffffd8);
  std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  std::__cxx11::string::~string(local_98);
  profiling::JSONProfiler::AggregateProfilingJSON
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  if (*(int *)(in_RDI + 6) == 0) {
    std::__cxx11::string::string(local_d0);
    adios2::transport::FileFStream::FileFStream(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8)
    ;
    adios2sys::SystemTools::GetFilenameName(in_stack_fffffffffffff998);
    _Var1 = getpid();
    std::__cxx11::stringstream::stringstream(local_598);
    this_00 = (void *)std::ostream::operator<<(&stack0xfffffffffffffa78,std::hex);
    std::ostream::operator<<(this_00,_Var1);
    std::operator+((char *)in_stack_fffffffffffff9c8,in_RDI);
    std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    std::__cxx11::stringstream::str();
    std::operator+(__lhs,__rhs);
    std::operator+(in_stack_fffffffffffff988,in_stack_fffffffffffff980);
    in_stack_fffffffffffff990 = local_d0;
    this_02 = local_5b8;
    std::__cxx11::string::operator=(in_stack_fffffffffffff990,this_02);
    std::__cxx11::string::~string(this_02);
    std::__cxx11::string::~string(local_5d8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff9c8);
    std::__cxx11::string::~string(local_5f8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff9e8);
    __filename = (char *)std::__cxx11::string::c_str();
    remove(__filename);
    adios2::transport::FileFStream::Open
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
               (bool)in_stack_fffffffffffffba3,(bool)in_stack_fffffffffffffba2);
    this_01 = (FileFStream *)
              std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)0xa69193);
    std::vector<char,_std::allocator<char>_>::size(&local_b0);
    adios2::transport::FileFStream::Write
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
               in_stack_fffffffffffffa78);
    adios2::transport::FileFStream::Close(in_stack_fffffffffffffa40);
    std::__cxx11::stringstream::~stringstream(local_598);
    std::__cxx11::string::~string(local_408);
    adios2::transport::FileFStream::~FileFStream(this_01);
    std::__cxx11::string::~string(local_d0);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff990);
  std::__cxx11::string::~string(local_78);
  std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~vector((vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_> *)
          in_stack_fffffffffffff990);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff990);
  return;
}

Assistant:

void BP5Reader::FlushProfiler()
{
    auto transportTypes = m_DataFileManager.GetTransportsTypes();
    auto transportProfilers = m_DataFileManager.GetTransportsProfilers();

    auto lf_AddMe = [&](transportman::TransportMan &tm) -> void {
        auto tmpT = tm.GetTransportsTypes();
        auto tmpP = tm.GetTransportsProfilers();

        if (tmpT.size() > 0)
        {
            transportTypes.insert(transportTypes.end(), tmpT.begin(), tmpT.end());
            transportProfilers.insert(transportProfilers.end(), tmpP.begin(), tmpP.end());
        }
    };

    lf_AddMe(m_MDFileManager);
    lf_AddMe(m_MDIndexFileManager);
    lf_AddMe(m_FileMetaMetadataManager);

    for (unsigned int i = 0; i < m_Threads; ++i)
    {
        lf_AddMe(fileManagers[i]);
    }

    const std::string LineJSON(
        m_JSONProfiler.GetRankProfilingJSON(transportTypes, transportProfilers) + ",\n");

    const std::vector<char> profilingJSON(m_JSONProfiler.AggregateProfilingJSON(LineJSON));

    if (m_RankMPI == 0)
    {
        std::string profileFileName;
        transport::FileFStream profilingJSONStream(m_Comm);
        std::string bpBaseName = adios2sys::SystemTools::GetFilenameName(m_Name);

        auto PID = getpid();
        std::stringstream PIDstr;
        PIDstr << std::hex << PID;
        // write profile json in /tmp
        profileFileName = "/tmp/" + bpBaseName + "_" + PIDstr.str() + "_profiling.json";

        try
        {
            (void)remove(profileFileName.c_str());
            profilingJSONStream.Open(profileFileName, Mode::Write);
            profilingJSONStream.Write(profilingJSON.data(), profilingJSON.size());
            profilingJSONStream.Close();
        }
        catch (...)
        { // do nothing
        }
    }
}